

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O2

void __thiscall TypeTest_TestTypeRelations_Test::TestBody(TypeTest_TestTypeRelations_Test *this)

{
  HeapType heapType;
  HeapType heapType_00;
  Type a;
  Type lub;
  Type a_00;
  anon_class_1_0_00000001 *a_01;
  Type b;
  Type b_00;
  Entry *this_00;
  _Storage<wasm::HeapType,_true> _Var1;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *pvVar2;
  Type in_R8;
  char *in_R9;
  optional<wasm::HeapType> other;
  _Alloc_hider local_d8;
  Type nullAny;
  Type local_b8;
  Type sup;
  undefined1 auStack_a8 [8];
  Type any;
  __index_type local_90;
  Type local_88;
  Type sub;
  Type nullSub;
  Type none;
  Type exactSub;
  Type nullExactSup;
  Type nullExactSub;
  Type nullNone;
  Type nullSup;
  Type exactSup;
  Type nullFunc;
  Type func;
  
  ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&nullNone,2);
  auStack_a8 = (undefined1  [8])0x0;
  any.id = 0;
  nullAny.id = 0;
  local_d8._M_p = (pointer)&nullNone;
  this_00 = ::wasm::TypeBuilder::Entry::setOpen((Entry *)&stack0xffffffffffffff28,true);
  ::wasm::TypeBuilder::Entry::operator=(this_00,(Struct *)auStack_a8);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_a8);
  auStack_a8 = (undefined1  [8])0x0;
  any.id = 0;
  nullAny.id = 1;
  local_d8._M_p = (pointer)&nullNone;
  ::wasm::TypeBuilder::Entry::operator=((Entry *)&stack0xffffffffffffff28,(Struct *)auStack_a8);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_a8);
  any.id = 1;
  nullAny.id = 0;
  local_d8._M_p = (pointer)&nullNone;
  auStack_a8 = (undefined1  [8])&nullNone;
  _Var1._M_value =
       ::wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&stack0xffffffffffffff28);
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id = (HeapType)(HeapType)_Var1;
  ::wasm::TypeBuilder::Entry::subTypeOf((Entry *)auStack_a8,other);
  ::wasm::TypeBuilder::build();
  sup.id = 0;
  local_b8.id._0_1_ = (internal)(local_90 == '\0');
  if ((bool)local_b8.id._0_1_) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sup);
    pvVar2 = std::
             get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                       ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         *)auStack_a8);
    heapType.id = ((pvVar2->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                   _M_impl.super__Vector_impl_data._M_start)->id;
    pvVar2 = std::
             get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                       ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         *)auStack_a8);
    heapType_00.id =
         (pvVar2->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
         super__Vector_impl_data._M_start[1].id;
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         *)auStack_a8);
    ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&nullNone);
    ::wasm::Type::Type((Type *)auStack_a8,(HeapType)0x20,NonNullable,Inexact);
    ::wasm::Type::Type((Type *)&stack0xffffffffffffff28,(HeapType)0x20,Nullable,Inexact);
    ::wasm::Type::Type(&local_b8,heapType,NonNullable,Inexact);
    ::wasm::Type::Type(&nullNone,heapType,Nullable,Inexact);
    ::wasm::Type::Type(&nullSup,heapType,NonNullable,Exact);
    ::wasm::Type::Type(&exactSub,heapType,Nullable,Exact);
    ::wasm::Type::Type(&local_88,heapType_00,NonNullable,Inexact);
    ::wasm::Type::Type(&sub,heapType_00,Nullable,Inexact);
    ::wasm::Type::Type(&none,heapType_00,NonNullable,Exact);
    ::wasm::Type::Type(&nullExactSup,heapType_00,Nullable,Exact);
    ::wasm::Type::Type(&nullSub,(HeapType)0x58,NonNullable,Inexact);
    ::wasm::Type::Type(&nullExactSub,(HeapType)0x58,Nullable,Inexact);
    ::wasm::Type::Type(&nullFunc,(HeapType)0x10,NonNullable,Inexact);
    ::wasm::Type::Type(&exactSup,(HeapType)0x10,Nullable,Inexact);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)auStack_a8,(Type)auStack_a8,(Type)auStack_a8,
               (Type)auStack_a8,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)auStack_a8,(Type)local_d8._M_p,(Type)local_d8._M_p,
               (Type)auStack_a8,in_R8);
    a.id._1_7_ = local_b8.id._1_7_;
    a.id._0_1_ = local_b8.id._0_1_;
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)auStack_a8,a,(Type)auStack_a8,a,in_R8);
    lub.id._1_7_ = local_b8.id._1_7_;
    lub.id._0_1_ = local_b8.id._0_1_;
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)auStack_a8,nullNone,(Type)local_d8._M_p,lub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)auStack_a8,nullSup,(Type)auStack_a8,nullSup,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)auStack_a8,exactSub,(Type)local_d8._M_p,nullSup,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)auStack_a8,local_88,(Type)auStack_a8,local_88,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)auStack_a8,sub,(Type)local_d8._M_p,local_88,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)auStack_a8,none,(Type)auStack_a8,none,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)auStack_a8,nullExactSup,(Type)local_d8._M_p,none,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)auStack_a8,nullSub,(Type)auStack_a8,nullSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)auStack_a8,nullExactSub,(Type)local_d8._M_p,nullSub,in_R8)
    ;
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)auStack_a8,nullFunc,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)auStack_a8,exactSup,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)auStack_a8,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)auStack_a8,(Type)0x1,(Type)auStack_a8,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_d8._M_p,(Type)local_d8._M_p,(Type)local_d8._M_p,
               (Type)local_d8._M_p,in_R8);
    a_00.id._1_7_ = local_b8.id._1_7_;
    a_00.id._0_1_ = local_b8.id._0_1_;
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_d8._M_p,a_00,(Type)local_d8._M_p,a_00,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_d8._M_p,nullNone,(Type)local_d8._M_p,nullNone,in_R8)
    ;
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_d8._M_p,nullSup,(Type)local_d8._M_p,nullSup,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_d8._M_p,exactSub,(Type)local_d8._M_p,exactSub,in_R8)
    ;
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_d8._M_p,local_88,(Type)local_d8._M_p,local_88,in_R8)
    ;
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_d8._M_p,sub,(Type)local_d8._M_p,sub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_d8._M_p,none,(Type)local_d8._M_p,none,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_d8._M_p,nullExactSup,(Type)local_d8._M_p,
               nullExactSup,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_d8._M_p,nullSub,(Type)local_d8._M_p,nullSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_d8._M_p,nullExactSub,(Type)local_d8._M_p,
               nullExactSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_d8._M_p,nullFunc,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_d8._M_p,exactSup,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_d8._M_p,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_d8._M_p,(Type)0x1,(Type)local_d8._M_p,(Type)0x1,
               in_R8);
    a_01 = (anon_class_1_0_00000001 *)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_);
    TestBody::anon_class_1_0_00000001::operator()(a_01,(Type)a_01,(Type)a_01,(Type)a_01,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_),nullNone,
               nullNone,(Type)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_),in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_),nullSup,
               (Type)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_),nullSup,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_),exactSub,
               nullNone,nullSup,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_),local_88,
               (Type)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_),local_88,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_),sub,nullNone
               ,local_88,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_),none,
               (Type)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_),none,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_),nullExactSup
               ,nullNone,none,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_),nullSub,
               (Type)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_),nullSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_),nullExactSub
               ,nullNone,nullSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_),nullFunc,
               (Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_),exactSup,
               (Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_),(Type)0x2,
               (Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_),(Type)0x1,
               (Type)CONCAT71(local_b8.id._1_7_,local_b8.id._0_1_),(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullNone.id,(Type)nullNone.id,(Type)nullNone.id,
               (Type)nullNone.id,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullNone.id,nullSup,(Type)nullNone.id,nullSup,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullNone.id,exactSub,(Type)nullNone.id,exactSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullNone.id,local_88,(Type)nullNone.id,local_88,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullNone.id,sub,(Type)nullNone.id,sub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullNone.id,none,(Type)nullNone.id,none,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullNone.id,nullExactSup,(Type)nullNone.id,nullExactSup,
               in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullNone.id,nullSub,(Type)nullNone.id,nullSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullNone.id,nullExactSub,(Type)nullNone.id,nullExactSub,
               in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullNone.id,nullFunc,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullNone.id,exactSup,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullNone.id,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullNone.id,(Type)0x1,(Type)nullNone.id,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullSup.id,(Type)nullSup.id,(Type)nullSup.id,
               (Type)nullSup.id,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullSup.id,exactSub,exactSub,(Type)nullSup.id,in_R8);
    b.id._1_7_ = local_b8.id._1_7_;
    b.id._0_1_ = local_b8.id._0_1_;
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullSup.id,local_88,b,nullSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullSup.id,sub,nullNone,nullSub,in_R8);
    b_00.id._1_7_ = local_b8.id._1_7_;
    b_00.id._0_1_ = local_b8.id._0_1_;
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullSup.id,none,b_00,nullSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullSup.id,nullExactSup,nullNone,nullSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullSup.id,nullSub,(Type)nullSup.id,nullSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullSup.id,nullExactSub,exactSub,nullSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullSup.id,nullFunc,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullSup.id,exactSup,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullSup.id,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullSup.id,(Type)0x1,(Type)nullSup.id,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)exactSub.id,(Type)exactSub.id,(Type)exactSub.id,
               (Type)exactSub.id,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)exactSub.id,local_88,nullNone,nullSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)exactSub.id,sub,nullNone,nullExactSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)exactSub.id,none,nullNone,nullSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)exactSub.id,nullExactSup,nullNone,nullExactSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)exactSub.id,nullSub,(Type)exactSub.id,nullSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)exactSub.id,nullExactSub,(Type)exactSub.id,nullExactSub,
               in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)exactSub.id,nullFunc,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)exactSub.id,exactSup,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)exactSub.id,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)exactSub.id,(Type)0x1,(Type)exactSub.id,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_88.id,(Type)local_88.id,(Type)local_88.id,
               (Type)local_88.id,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_88.id,sub,sub,(Type)local_88.id,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_88.id,none,(Type)local_88.id,none,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_88.id,nullExactSup,sub,none,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_88.id,nullSub,(Type)local_88.id,nullSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_88.id,nullExactSub,sub,nullSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_88.id,nullFunc,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_88.id,exactSup,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_88.id,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_88.id,(Type)0x1,(Type)local_88.id,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)sub.id,(Type)sub.id,(Type)sub.id,(Type)sub.id,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)sub.id,none,(Type)sub.id,none,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)sub.id,nullExactSup,(Type)sub.id,nullExactSup,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)sub.id,nullSub,(Type)sub.id,nullSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)sub.id,nullExactSub,(Type)sub.id,nullExactSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)sub.id,nullFunc,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)sub.id,exactSup,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)sub.id,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)sub.id,(Type)0x1,(Type)sub.id,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)none.id,(Type)none.id,(Type)none.id,(Type)none.id,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)none.id,nullExactSup,nullExactSup,(Type)none.id,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)none.id,nullSub,(Type)none.id,nullSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)none.id,nullExactSub,nullExactSup,nullSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)none.id,nullFunc,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)none.id,exactSup,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)none.id,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)none.id,(Type)0x1,(Type)none.id,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullExactSup.id,(Type)nullExactSup.id,
               (Type)nullExactSup.id,(Type)nullExactSup.id,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullExactSup.id,nullSub,(Type)nullExactSup.id,nullSub,
               in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullExactSup.id,nullExactSub,(Type)nullExactSup.id,
               nullExactSub,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullExactSup.id,nullFunc,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullExactSup.id,exactSup,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullExactSup.id,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullExactSup.id,(Type)0x1,(Type)nullExactSup.id,(Type)0x1,
               in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullSub.id,(Type)nullSub.id,(Type)nullSub.id,
               (Type)nullSub.id,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullSub.id,nullExactSub,nullExactSub,(Type)nullSub.id,
               in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullSub.id,nullFunc,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullSub.id,exactSup,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullSub.id,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullSub.id,(Type)0x1,(Type)nullSub.id,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullExactSub.id,(Type)nullExactSub.id,
               (Type)nullExactSub.id,(Type)nullExactSub.id,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullExactSub.id,nullFunc,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullExactSub.id,exactSup,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullExactSub.id,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)nullExactSub.id,(Type)0x1,(Type)nullExactSub.id,(Type)0x1,
               in_R8);
  }
  else {
    testing::Message::Message((Message *)&nullSup);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&stack0xffffffffffffff28,(internal *)&local_b8,(AssertionResult *)"built",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&exactSub,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x4bb,local_d8._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&exactSub,(Message *)&nullSup);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&exactSub);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
    if (nullSup.id != 0) {
      (**(code **)(*(long *)nullSup.id + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sup);
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         *)auStack_a8);
    ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&nullNone);
  }
  return;
}

Assistant:

TEST_F(TypeTest, TestTypeRelations) {
  HeapType definedSuper, definedSub;
  {
    TypeBuilder builder(2);
    builder[0].setOpen() = Struct();
    builder[1] = Struct();
    builder[1].subTypeOf(builder[0]);
    auto built = builder.build();
    ASSERT_TRUE(built);
    definedSuper = (*built)[0];
    definedSub = (*built)[1];
  }

  Type any = Type(HeapType::any, NonNullable, Inexact);
  Type nullAny = Type(HeapType::any, Nullable, Inexact);

  Type sup = Type(definedSuper, NonNullable, Inexact);
  Type nullSup = Type(definedSuper, Nullable, Inexact);
  Type exactSup = Type(definedSuper, NonNullable, Exact);
  Type nullExactSup = Type(definedSuper, Nullable, Exact);

  Type sub = Type(definedSub, NonNullable, Inexact);
  Type nullSub = Type(definedSub, Nullable, Inexact);
  Type exactSub = Type(definedSub, NonNullable, Exact);
  Type nullExactSub = Type(definedSub, Nullable, Exact);

  Type none = Type(HeapType::none, NonNullable, Inexact);
  Type nullNone = Type(HeapType::none, Nullable, Inexact);

  Type func = Type(HeapType::func, NonNullable, Inexact);
  Type nullFunc = Type(HeapType::func, Nullable, Inexact);

  Type i32 = Type::i32;
  Type unreachable = Type::unreachable;

  auto assertLUB = [](Type a, Type b, Type lub, Type glb) {
    auto lub1 = Type::getLeastUpperBound(a, b);
    auto lub2 = Type::getLeastUpperBound(b, a);
    EXPECT_EQ(lub, lub1);
    EXPECT_EQ(lub1, lub2);
    if (lub != Type::none) {
      EXPECT_TRUE(Type::isSubType(a, lub));
      EXPECT_TRUE(Type::isSubType(b, lub));
    }
    auto glb1 = Type::getGreatestLowerBound(a, b);
    auto glb2 = Type::getGreatestLowerBound(b, a);
    EXPECT_EQ(glb, glb1);
    EXPECT_EQ(glb, glb2);
    EXPECT_TRUE(Type::isSubType(glb, a));
    EXPECT_TRUE(Type::isSubType(glb, b));
    if (a == b) {
      EXPECT_TRUE(Type::isSubType(a, b));
      EXPECT_TRUE(Type::isSubType(b, a));
      EXPECT_EQ(lub, a);
      EXPECT_EQ(glb, a);
    } else if (lub == b) {
      EXPECT_TRUE(Type::isSubType(a, b));
      EXPECT_FALSE(Type::isSubType(b, a));
      EXPECT_EQ(glb, a);
    } else if (lub == a) {
      EXPECT_FALSE(Type::isSubType(a, b));
      EXPECT_TRUE(Type::isSubType(b, a));
      EXPECT_EQ(glb, b);
    } else if (lub != Type::none) {
      EXPECT_FALSE(Type::isSubType(a, b));
      EXPECT_FALSE(Type::isSubType(b, a));
      EXPECT_NE(glb, a);
      EXPECT_NE(glb, b);
    } else {
      EXPECT_FALSE(Type::isSubType(a, b));
      EXPECT_FALSE(Type::isSubType(b, a));
    }

    if (a.isRef() && b.isRef()) {
      auto htA = a.getHeapType();
      auto htB = b.getHeapType();

      if (lub == Type::none) {
        EXPECT_NE(htA.getTop(), htB.getTop());
        EXPECT_NE(htA.getBottom(), htB.getBottom());
      } else {
        EXPECT_EQ(htA.getTop(), htB.getTop());
        EXPECT_EQ(htA.getBottom(), htB.getBottom());
      }
    }
  };

  assertLUB(any, any, any, any);
  assertLUB(any, nullAny, nullAny, any);
  assertLUB(any, sup, any, sup);
  assertLUB(any, nullSup, nullAny, sup);
  assertLUB(any, exactSup, any, exactSup);
  assertLUB(any, nullExactSup, nullAny, exactSup);
  assertLUB(any, sub, any, sub);
  assertLUB(any, nullSub, nullAny, sub);
  assertLUB(any, exactSub, any, exactSub);
  assertLUB(any, nullExactSub, nullAny, exactSub);
  assertLUB(any, none, any, none);
  assertLUB(any, nullNone, nullAny, none);
  assertLUB(any, func, Type(Type::none), unreachable);
  assertLUB(any, nullFunc, Type(Type::none), unreachable);
  assertLUB(any, i32, Type(Type::none), unreachable);
  assertLUB(any, unreachable, any, unreachable);

  assertLUB(nullAny, nullAny, nullAny, nullAny);
  assertLUB(nullAny, sup, nullAny, sup);
  assertLUB(nullAny, nullSup, nullAny, nullSup);
  assertLUB(nullAny, exactSup, nullAny, exactSup);
  assertLUB(nullAny, nullExactSup, nullAny, nullExactSup);
  assertLUB(nullAny, sub, nullAny, sub);
  assertLUB(nullAny, nullSub, nullAny, nullSub);
  assertLUB(nullAny, exactSub, nullAny, exactSub);
  assertLUB(nullAny, nullExactSub, nullAny, nullExactSub);
  assertLUB(nullAny, none, nullAny, none);
  assertLUB(nullAny, nullNone, nullAny, nullNone);
  assertLUB(nullAny, func, Type(Type::none), unreachable);
  assertLUB(nullAny, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullAny, i32, Type(Type::none), unreachable);
  assertLUB(nullAny, unreachable, nullAny, unreachable);

  assertLUB(sup, sup, sup, sup);
  assertLUB(sup, nullSup, nullSup, sup);
  assertLUB(sup, exactSup, sup, exactSup);
  assertLUB(sup, nullExactSup, nullSup, exactSup);
  assertLUB(sup, sub, sup, sub);
  assertLUB(sup, nullSub, nullSup, sub);
  assertLUB(sup, exactSub, sup, exactSub);
  assertLUB(sup, nullExactSub, nullSup, exactSub);
  assertLUB(sup, none, sup, none);
  assertLUB(sup, nullNone, nullSup, none);
  assertLUB(sup, func, Type(Type::none), unreachable);
  assertLUB(sup, nullFunc, Type(Type::none), unreachable);
  assertLUB(sup, i32, Type(Type::none), unreachable);
  assertLUB(sup, unreachable, sup, unreachable);

  assertLUB(nullSup, nullSup, nullSup, nullSup);
  assertLUB(nullSup, exactSup, nullSup, exactSup);
  assertLUB(nullSup, nullExactSup, nullSup, nullExactSup);
  assertLUB(nullSup, sub, nullSup, sub);
  assertLUB(nullSup, nullSub, nullSup, nullSub);
  assertLUB(nullSup, exactSub, nullSup, exactSub);
  assertLUB(nullSup, nullExactSub, nullSup, nullExactSub);
  assertLUB(nullSup, none, nullSup, none);
  assertLUB(nullSup, nullNone, nullSup, nullNone);
  assertLUB(nullSup, func, Type(Type::none), unreachable);
  assertLUB(nullSup, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullSup, i32, Type(Type::none), unreachable);
  assertLUB(nullSup, unreachable, nullSup, unreachable);

  assertLUB(exactSup, exactSup, exactSup, exactSup);
  assertLUB(exactSup, nullExactSup, nullExactSup, exactSup);
  assertLUB(exactSup, sub, sup, none);
  assertLUB(exactSup, nullSub, nullSup, none);
  assertLUB(exactSup, exactSub, sup, none);
  assertLUB(exactSup, nullExactSub, nullSup, none);
  assertLUB(exactSup, none, exactSup, none);
  assertLUB(exactSup, nullNone, nullExactSup, none);
  assertLUB(exactSup, func, Type(Type::none), unreachable);
  assertLUB(exactSup, nullFunc, Type(Type::none), unreachable);
  assertLUB(exactSup, i32, Type(Type::none), unreachable);
  assertLUB(exactSup, unreachable, exactSup, unreachable);

  assertLUB(nullExactSup, nullExactSup, nullExactSup, nullExactSup);
  assertLUB(nullExactSup, sub, nullSup, none);
  assertLUB(nullExactSup, nullSub, nullSup, nullNone);
  assertLUB(nullExactSup, exactSub, nullSup, none);
  assertLUB(nullExactSup, nullExactSub, nullSup, nullNone);
  assertLUB(nullExactSup, none, nullExactSup, none);
  assertLUB(nullExactSup, nullNone, nullExactSup, nullNone);
  assertLUB(nullExactSup, func, Type(Type::none), unreachable);
  assertLUB(nullExactSup, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullExactSup, i32, Type(Type::none), unreachable);
  assertLUB(nullExactSup, unreachable, nullExactSup, unreachable);

  assertLUB(sub, sub, sub, sub);
  assertLUB(sub, nullSub, nullSub, sub);
  assertLUB(sub, exactSub, sub, exactSub);
  assertLUB(sub, nullExactSub, nullSub, exactSub);
  assertLUB(sub, none, sub, none);
  assertLUB(sub, nullNone, nullSub, none);
  assertLUB(sub, func, Type(Type::none), unreachable);
  assertLUB(sub, nullFunc, Type(Type::none), unreachable);
  assertLUB(sub, i32, Type(Type::none), unreachable);
  assertLUB(sub, unreachable, sub, unreachable);

  assertLUB(nullSub, nullSub, nullSub, nullSub);
  assertLUB(nullSub, exactSub, nullSub, exactSub);
  assertLUB(nullSub, nullExactSub, nullSub, nullExactSub);
  assertLUB(nullSub, none, nullSub, none);
  assertLUB(nullSub, nullNone, nullSub, nullNone);
  assertLUB(nullSub, func, Type(Type::none), unreachable);
  assertLUB(nullSub, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullSub, i32, Type(Type::none), unreachable);
  assertLUB(nullSub, unreachable, nullSub, unreachable);

  assertLUB(exactSub, exactSub, exactSub, exactSub);
  assertLUB(exactSub, nullExactSub, nullExactSub, exactSub);
  assertLUB(exactSub, none, exactSub, none);
  assertLUB(exactSub, nullNone, nullExactSub, none);
  assertLUB(exactSub, func, Type(Type::none), unreachable);
  assertLUB(exactSub, nullFunc, Type(Type::none), unreachable);
  assertLUB(exactSub, i32, Type(Type::none), unreachable);
  assertLUB(exactSub, unreachable, exactSub, unreachable);

  assertLUB(nullExactSub, nullExactSub, nullExactSub, nullExactSub);
  assertLUB(nullExactSub, none, nullExactSub, none);
  assertLUB(nullExactSub, nullNone, nullExactSub, nullNone);
  assertLUB(nullExactSub, func, Type(Type::none), unreachable);
  assertLUB(nullExactSub, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullExactSub, i32, Type(Type::none), unreachable);
  assertLUB(nullExactSub, unreachable, nullExactSub, unreachable);

  assertLUB(none, none, none, none);
  assertLUB(none, nullNone, nullNone, none);
  assertLUB(none, func, Type(Type::none), unreachable);
  assertLUB(none, nullFunc, Type(Type::none), unreachable);
  assertLUB(none, i32, Type(Type::none), unreachable);
  assertLUB(none, unreachable, none, unreachable);

  assertLUB(nullNone, nullNone, nullNone, nullNone);
  assertLUB(nullNone, func, Type(Type::none), unreachable);
  assertLUB(nullNone, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullNone, i32, Type(Type::none), unreachable);
  assertLUB(nullNone, unreachable, nullNone, unreachable);
}